

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void config_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  fdb_config *unaff_RBX;
  fdb_config *pfVar5;
  uint uVar6;
  ulong unaff_RBP;
  char *pcVar7;
  fdb_doc *pfVar8;
  fdb_kvs_handle **unaff_R12;
  fdb_file_handle **ptr_fhandle;
  ulong uVar9;
  fdb_kvs_handle *unaff_R13;
  fdb_config *unaff_R14;
  char *unaff_R15;
  char *kvs_config;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  timeval __test_begin;
  fdb_file_info finfo;
  fdb_config fconfig;
  char fname [256];
  fdb_doc *pfStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  fdb_file_handle *pfStack_16d0;
  timeval tStack_16c8;
  fdb_kvs_config fStack_16b8;
  fdb_config fStack_16a0;
  char acStack_15a8 [256];
  char *pcStack_14a8;
  fdb_config *pfStack_14a0;
  fdb_config *pfStack_1498;
  fdb_file_handle *pfStack_1488;
  fdb_kvs_handle *pfStack_1480;
  fdb_kvs_config fStack_1478;
  timeval tStack_1460;
  char acStack_1450 [264];
  fdb_config fStack_1348;
  char acStack_1250 [256];
  char acStack_1150 [264];
  char *pcStack_1048;
  fdb_file_handle **ppfStack_1040;
  fdb_kvs_handle *pfStack_1038;
  fdb_config *pfStack_1030;
  fdb_kvs_config *pfStack_1028;
  code *pcStack_1020;
  fdb_kvs_handle *pfStack_1008;
  fdb_file_handle *pfStack_1000;
  fdb_iterator *pfStack_ff8;
  timeval tStack_ff0;
  fdb_kvs_config fStack_fe0;
  fdb_file_handle *apfStack_fc8 [32];
  fdb_config fStack_ec8;
  fdb_config fStack_dc0;
  char acStack_cc8 [264];
  fdb_config *pfStack_bc0;
  fdb_kvs_handle **ppfStack_bb8;
  fdb_kvs_handle *pfStack_bb0;
  fdb_config *pfStack_ba8;
  char *pcStack_ba0;
  code *pcStack_b98;
  fdb_file_handle *pfStack_b88;
  fdb_kvs_handle *pfStack_b80;
  fdb_doc *pfStack_b78;
  undefined1 auStack_b70 [40];
  fdb_seqnum_t fStack_b48;
  uint64_t uStack_b40;
  void *pvStack_b38;
  fdb_config *pfStack_b30;
  uint64_t uStack_b28;
  fdb_kvs_config fStack_b20;
  timeval tStack_b08;
  undefined1 auStack_af8 [72];
  fdb_config fStack_ab0;
  char acStack_9b0 [256];
  fdb_config fStack_8b0;
  fdb_config *pfStack_7b8;
  fdb_config *pfStack_7b0;
  fdb_doc *pfStack_798;
  fdb_kvs_handle *pfStack_790;
  fdb_file_handle *pfStack_788;
  fdb_doc *pfStack_780;
  undefined1 auStack_778 [40];
  fdb_seqnum_t fStack_750;
  uint64_t uStack_748;
  fdb_compaction_callback p_Stack_740;
  fdb_config *pfStack_738;
  void *pvStack_730;
  fdb_kvs_config fStack_720;
  timeval tStack_708;
  uint8_t auStack_6f8 [256];
  fdb_config fStack_5f8;
  fdb_config fStack_4f8;
  fdb_config *pfStack_400;
  fdb_config *pfStack_3f8;
  fdb_file_handle *pfStack_3e8;
  fdb_kvs_handle *pfStack_3e0;
  size_t sStack_3d8;
  int *piStack_3d0;
  timeval tStack_3c8;
  fdb_config fStack_3b8;
  fdb_config *pfStack_2c0;
  fdb_file_handle *local_2b8;
  int local_2ac;
  fdb_kvs_handle *local_2a8;
  fdb_kvs_config local_2a0;
  timeval local_288;
  undefined1 local_278 [76];
  int local_22c;
  docio_handle *local_228;
  uint64_t local_1c0;
  fdb_config local_138;
  
  pfStack_2c0 = (fdb_config *)0x110026;
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  pfStack_2c0 = (fdb_config *)0x11002b;
  memleak_start();
  pfStack_2c0 = (fdb_config *)0x110037;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2c0 = (fdb_config *)0x11003c;
  sVar3 = fdb_get_buffer_cache_used();
  if (sVar3 == 0) {
    unaff_RBX = &local_138;
    pfStack_2c0 = (fdb_config *)0x110055;
    fdb_get_default_config();
    unaff_R14 = (fdb_config *)(local_278 + 0x48);
    pfStack_2c0 = (fdb_config *)0x11006d;
    memcpy(unaff_R14,unaff_RBX,0xf8);
    local_228 = (docio_handle *)0xffffffffffffffff;
    pfStack_2c0 = (fdb_config *)0x110087;
    fVar1 = fdb_open(&local_2b8,"./dummy1",unaff_R14);
    if (fVar1 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_001102ee;
    unaff_RBX = &local_138;
    pfStack_2c0 = (fdb_config *)0x1100a0;
    fdb_get_default_config();
    unaff_R14 = (fdb_config *)(local_278 + 0x48);
    pfStack_2c0 = (fdb_config *)0x1100b8;
    memcpy(unaff_R14,unaff_RBX,0xf8);
    local_1c0 = 0x78;
    pfStack_2c0 = (fdb_config *)0x1100d2;
    fVar1 = fdb_open(&local_2b8,"./dummy1",unaff_R14);
    if (fVar1 != FDB_RESULT_INVALID_CONFIG) goto LAB_001102f3;
    unaff_R14 = &local_138;
    pfStack_2c0 = (fdb_config *)0x1100eb;
    fdb_get_default_config();
    pfStack_2c0 = (fdb_config *)0x110100;
    memcpy(local_278 + 0x48,unaff_R14,0xf8);
    pfStack_2c0 = (fdb_config *)0x11010a;
    fdb_get_default_kvs_config();
    unaff_RBP = 4;
    unaff_R15 = "justonekv";
    unaff_R12 = &local_2a8;
    unaff_R13 = (fdb_kvs_handle *)local_278;
    do {
      pfStack_2c0 = (fdb_config *)0x110133;
      sprintf((char *)unaff_R14,"dummy%d",unaff_RBP);
      pfStack_2c0 = (fdb_config *)0x110146;
      fVar1 = fdb_open(&local_2b8,(char *)unaff_R14,(fdb_config *)(local_278 + 0x48));
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001102da:
        pfStack_2c0 = (fdb_config *)0x1102df;
        config_test();
LAB_001102df:
        pfStack_2c0 = (fdb_config *)0x1102e4;
        config_test();
LAB_001102e4:
        pfStack_2c0 = (fdb_config *)0x1102e9;
        config_test();
        goto LAB_001102e9;
      }
      pfStack_2c0 = (fdb_config *)0x110162;
      fVar1 = fdb_kvs_open(local_2b8,unaff_R12,"justonekv",&local_2a0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_2c0 = (fdb_config *)0x1102da;
        config_test();
        goto LAB_001102da;
      }
      pfStack_2c0 = (fdb_config *)0x11016f;
      unaff_RBX = (fdb_config *)fdb_get_buffer_cache_used();
      pfStack_2c0 = (fdb_config *)0x11017e;
      fVar1 = fdb_get_file_info(local_2b8,(fdb_file_info *)unaff_R13);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001102e4;
      iVar2 = local_22c;
      if ((fdb_file_handle *)local_278._40_8_ != (fdb_file_handle *)(ulong)(uint)(local_22c * 7)) {
        pfStack_2c0 = (fdb_config *)0x1101d6;
        config_test();
        iVar2 = local_2ac;
      }
      if (unaff_RBX != (fdb_config *)(ulong)(uint)(iVar2 * 2)) {
        pfStack_2c0 = (fdb_config *)0x1101ec;
        config_test();
      }
      pfStack_2c0 = (fdb_config *)0x1101ad;
      fVar1 = fdb_close(local_2b8);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001102df;
      uVar6 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar6;
    } while (uVar6 != 0);
    pfStack_2c0 = (fdb_config *)0x110206;
    fVar1 = fdb_open(&local_2b8,(char *)&local_138,(fdb_config *)(local_278 + 0x48));
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001102f8;
    pfStack_2c0 = (fdb_config *)0x110228;
    fVar1 = fdb_kvs_open(local_2b8,&local_2a8,"justonekv",&local_2a0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001102fd;
    pfStack_2c0 = (fdb_config *)0x110253;
    fVar1 = fdb_set_kv(local_2a8,"key",3,"body",5);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_2c0 = (fdb_config *)0x110260;
      sVar3 = fdb_get_buffer_cache_used();
      if (sVar3 != (uint)(local_22c << 3)) {
        pfStack_2c0 = (fdb_config *)0x11027f;
        config_test();
      }
      pfStack_2c0 = (fdb_config *)0x110288;
      fdb_close(local_2b8);
      pfStack_2c0 = (fdb_config *)0x11028d;
      fdb_shutdown();
      pfStack_2c0 = (fdb_config *)0x110292;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_2c0 = (fdb_config *)0x1102c3;
      fprintf(_stderr,pcVar7,"forestdb config test");
      return;
    }
  }
  else {
LAB_001102e9:
    pfStack_2c0 = (fdb_config *)0x1102ee;
    config_test();
LAB_001102ee:
    pfStack_2c0 = (fdb_config *)0x1102f3;
    config_test();
LAB_001102f3:
    pfStack_2c0 = (fdb_config *)0x1102f8;
    config_test();
LAB_001102f8:
    pfStack_2c0 = (fdb_config *)0x1102fd;
    config_test();
LAB_001102fd:
    pfStack_2c0 = (fdb_config *)0x110302;
    config_test();
  }
  pfStack_2c0 = (fdb_config *)delete_reopen_test;
  config_test();
  pfStack_3f8 = (fdb_config *)0x11031b;
  pfStack_2c0 = unaff_RBX;
  gettimeofday(&tStack_3c8,(__timezone_ptr_t)0x0);
  pfStack_3f8 = (fdb_config *)0x110320;
  memleak_start();
  pfStack_3f8 = (fdb_config *)0x11032c;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_3f8 = (fdb_config *)0x110339;
  fdb_get_default_config();
  fStack_3b8.buffercache_size = 0;
  fStack_3b8.num_compactor_threads = 1;
  pfStack_3f8 = (fdb_config *)0x11035d;
  fVar1 = fdb_open(&pfStack_3e8,"./dummy3",&fStack_3b8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_3f8 = (fdb_config *)0x110376;
    fVar1 = fdb_kvs_open_default(pfStack_3e8,&pfStack_3e0,(fdb_kvs_config *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011056d;
    pfStack_3f8 = (fdb_config *)0x11038d;
    fVar1 = fdb_begin_transaction(pfStack_3e8,'\x02');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110572;
    pfStack_3f8 = (fdb_config *)0x1103b8;
    fVar1 = fdb_set_kv(pfStack_3e0,"foo",3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110577;
    pfStack_3f8 = (fdb_config *)0x1103cc;
    fVar1 = fdb_end_transaction(pfStack_3e8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011057c;
    pfStack_3f8 = (fdb_config *)0x1103f4;
    fVar1 = fdb_get_kv(pfStack_3e0,"foo",3,&piStack_3d0,&sStack_3d8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110581;
    if (sStack_3d8 != 5) {
      pfStack_3f8 = (fdb_config *)0x11040e;
      delete_reopen_test();
    }
    if ((char)piStack_3d0[1] != 'e' || *piStack_3d0 != 0x756c6176) goto LAB_00110586;
    pfStack_3f8 = (fdb_config *)0x11042e;
    fdb_free_block(piStack_3d0);
    pfStack_3f8 = (fdb_config *)0x11043d;
    fVar1 = fdb_begin_transaction(pfStack_3e8,'\x02');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011058b;
    pfStack_3f8 = (fdb_config *)0x11045b;
    fVar1 = fdb_del_kv(pfStack_3e0,"foo",3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110590;
    pfStack_3f8 = (fdb_config *)0x11046f;
    fVar1 = fdb_end_transaction(pfStack_3e8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110595;
    pfStack_3f8 = (fdb_config *)0x110497;
    fVar1 = fdb_get_kv(pfStack_3e0,"foo",3,&piStack_3d0,&sStack_3d8);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011059a;
    pfStack_3f8 = (fdb_config *)0x1104aa;
    fVar1 = fdb_close(pfStack_3e8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011059f;
    pfStack_3f8 = (fdb_config *)0x1104c8;
    fVar1 = fdb_open(&pfStack_3e8,"./dummy3",&fStack_3b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105a4;
    pfStack_3f8 = (fdb_config *)0x1104e1;
    fVar1 = fdb_kvs_open_default(pfStack_3e8,&pfStack_3e0,(fdb_kvs_config *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001105a9;
    pfStack_3f8 = (fdb_config *)0x110509;
    fVar1 = fdb_get_kv(pfStack_3e0,"foo",3,&piStack_3d0,&sStack_3d8);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105ae;
    pfStack_3f8 = (fdb_config *)0x11051c;
    fVar1 = fdb_close(pfStack_3e8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_3f8 = (fdb_config *)0x110529;
      fdb_shutdown();
      pfStack_3f8 = (fdb_config *)0x11052e;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_3f8 = (fdb_config *)0x11055f;
      fprintf(_stderr,pcVar7,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_3f8 = (fdb_config *)0x11056d;
    delete_reopen_test();
LAB_0011056d:
    pfStack_3f8 = (fdb_config *)0x110572;
    delete_reopen_test();
LAB_00110572:
    pfStack_3f8 = (fdb_config *)0x110577;
    delete_reopen_test();
LAB_00110577:
    pfStack_3f8 = (fdb_config *)0x11057c;
    delete_reopen_test();
LAB_0011057c:
    pfStack_3f8 = (fdb_config *)0x110581;
    delete_reopen_test();
LAB_00110581:
    pfStack_3f8 = (fdb_config *)0x110586;
    delete_reopen_test();
LAB_00110586:
    pfStack_3f8 = (fdb_config *)0x11058b;
    delete_reopen_test();
LAB_0011058b:
    pfStack_3f8 = (fdb_config *)0x110590;
    delete_reopen_test();
LAB_00110590:
    pfStack_3f8 = (fdb_config *)0x110595;
    delete_reopen_test();
LAB_00110595:
    pfStack_3f8 = (fdb_config *)0x11059a;
    delete_reopen_test();
LAB_0011059a:
    pfStack_3f8 = (fdb_config *)0x11059f;
    delete_reopen_test();
LAB_0011059f:
    pfStack_3f8 = (fdb_config *)0x1105a4;
    delete_reopen_test();
LAB_001105a4:
    pfStack_3f8 = (fdb_config *)0x1105a9;
    delete_reopen_test();
LAB_001105a9:
    pfStack_3f8 = (fdb_config *)0x1105ae;
    delete_reopen_test();
LAB_001105ae:
    pfStack_3f8 = (fdb_config *)0x1105b3;
    delete_reopen_test();
  }
  pfStack_3f8 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_7b0 = (fdb_config *)0x1105d1;
  pfStack_400 = &fStack_3b8;
  pfStack_3f8 = unaff_R14;
  gettimeofday(&tStack_708,(__timezone_ptr_t)0x0);
  pfStack_7b0 = (fdb_config *)0x1105d6;
  memleak_start();
  pfStack_7b0 = (fdb_config *)0x1105e2;
  system("rm -rf  dummy* > errorlog.txt");
  pvStack_730 = (void *)0x0;
  auStack_778._0_8_ = 0;
  auStack_778._8_8_ = 0;
  auStack_778._16_8_ = 0;
  auStack_778._24_8_ = 0;
  uStack_748 = 0;
  p_Stack_740 = (fdb_compaction_callback)0x0;
  auStack_778._32_8_ = auStack_6f8;
  pfStack_738 = &fStack_5f8;
  fStack_750 = 0xffffffffffffffff;
  pfVar5 = &fStack_4f8;
  pfStack_7b0 = (fdb_config *)0x110631;
  fdb_get_default_config();
  fStack_4f8.purging_interval = 1;
  fStack_4f8.seqtree_opt = '\x01';
  pfStack_7b0 = (fdb_config *)0x110649;
  fdb_get_default_kvs_config();
  pfStack_7b0 = (fdb_config *)0x11065d;
  fVar1 = fdb_open(&pfStack_788,"./dummy1",pfVar5);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_7b0 = (fdb_config *)0x11067e;
    fVar1 = fdb_kvs_open(pfStack_788,&pfStack_790,(char *)0x0,&fStack_720);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108c7;
    builtin_memcpy(auStack_6f8,"key",4);
    pfVar5 = &fStack_5f8;
    fStack_5f8.chunksize = 0x6f62;
    fStack_5f8._2_2_ = 0x7964;
    fStack_5f8.blocksize._0_1_ = 0;
    pfStack_7b0 = (fdb_config *)0x1106ab;
    auStack_778._0_8_ = strlen((char *)auStack_6f8);
    unaff_R14 = (fdb_config *)auStack_778;
    pfStack_7b0 = (fdb_config *)0x1106bb;
    auStack_778._16_8_ = strlen((char *)pfVar5);
    pfStack_7b0 = (fdb_config *)0x1106cc;
    fVar1 = fdb_set(pfStack_790,(fdb_doc *)unaff_R14);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108cc;
    pfStack_7b0 = (fdb_config *)0x1106e3;
    fVar1 = fdb_commit(pfStack_788,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d1;
    pfStack_7b0 = (fdb_config *)0x1106fa;
    fVar1 = fdb_del(pfStack_790,(fdb_doc *)auStack_778);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d6;
    pfStack_7b0 = (fdb_config *)0x110711;
    fVar1 = fdb_commit(pfStack_788,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108db;
    pfVar5 = (fdb_config *)&pfStack_798;
    pfStack_7b0 = (fdb_config *)0x110743;
    fdb_doc_create((fdb_doc **)pfVar5,auStack_6f8,auStack_778._0_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_7b0 = (fdb_config *)0x110750;
    fVar1 = fdb_get_metaonly(pfStack_790,pfStack_798);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e0;
    pfVar8 = pfStack_798;
    if (pfStack_798->deleted == false) {
      pfVar5 = (fdb_config *)&pfStack_780;
      pfStack_7b0 = (fdb_config *)0x110775;
      deleted_doc_get_api_test();
      pfVar8 = pfStack_780;
    }
    pfVar8->deleted = false;
    pfStack_7b0 = (fdb_config *)0x110786;
    fVar1 = fdb_get_metaonly_byseq(pfStack_790,pfVar8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108e5;
    pfVar8 = pfStack_798;
    if (pfStack_798->deleted == false) {
      pfVar5 = (fdb_config *)&pfStack_780;
      pfStack_7b0 = (fdb_config *)0x1107ab;
      deleted_doc_get_api_test();
      pfVar8 = pfStack_780;
    }
    pfVar8->deleted = false;
    pfStack_7b0 = (fdb_config *)0x1107bc;
    fVar1 = fdb_get_byoffset(pfStack_790,pfVar8);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ea;
    pfVar8 = pfStack_798;
    if (pfStack_798->deleted == false) {
      pfVar5 = (fdb_config *)&pfStack_780;
      pfStack_7b0 = (fdb_config *)0x1107e2;
      deleted_doc_get_api_test();
      pfVar8 = pfStack_780;
    }
    pfVar8->deleted = false;
    pfStack_7b0 = (fdb_config *)0x1107f3;
    fVar1 = fdb_get(pfStack_790,pfVar8);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ef;
    pfVar8 = pfStack_798;
    if (pfStack_798->deleted == true) {
      pfVar5 = (fdb_config *)&pfStack_780;
      pfStack_7b0 = (fdb_config *)0x110819;
      deleted_doc_get_api_test();
      pfVar8 = pfStack_780;
    }
    pfVar8->deleted = false;
    pfStack_7b0 = (fdb_config *)0x11082a;
    fVar1 = fdb_get_byseq(pfStack_790,pfVar8);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f4;
    if (pfStack_798->deleted == true) {
      pfVar5 = (fdb_config *)&pfStack_780;
      pfStack_7b0 = (fdb_config *)0x110850;
      deleted_doc_get_api_test();
      pfStack_798 = pfStack_780;
    }
    pfStack_7b0 = (fdb_config *)0x110858;
    fdb_doc_free(pfStack_798);
    pfStack_7b0 = (fdb_config *)0x110862;
    fVar1 = fdb_kvs_close(pfStack_790);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108f9;
    pfStack_7b0 = (fdb_config *)0x110874;
    fVar1 = fdb_close(pfStack_788);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_7b0 = (fdb_config *)0x110881;
      fdb_shutdown();
      pfStack_7b0 = (fdb_config *)0x110886;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_7b0 = (fdb_config *)0x1108b7;
      fprintf(_stderr,pcVar7,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_7b0 = (fdb_config *)0x1108c7;
    deleted_doc_get_api_test();
LAB_001108c7:
    pfStack_7b0 = (fdb_config *)0x1108cc;
    deleted_doc_get_api_test();
LAB_001108cc:
    pfStack_7b0 = (fdb_config *)0x1108d1;
    deleted_doc_get_api_test();
LAB_001108d1:
    pfStack_7b0 = (fdb_config *)0x1108d6;
    deleted_doc_get_api_test();
LAB_001108d6:
    pfStack_7b0 = (fdb_config *)0x1108db;
    deleted_doc_get_api_test();
LAB_001108db:
    pfStack_7b0 = (fdb_config *)0x1108e0;
    deleted_doc_get_api_test();
LAB_001108e0:
    pfStack_7b0 = (fdb_config *)0x1108e5;
    deleted_doc_get_api_test();
LAB_001108e5:
    pfStack_7b0 = (fdb_config *)0x1108ea;
    deleted_doc_get_api_test();
LAB_001108ea:
    pfStack_7b0 = (fdb_config *)0x1108ef;
    deleted_doc_get_api_test();
LAB_001108ef:
    pfStack_7b0 = (fdb_config *)0x1108f4;
    deleted_doc_get_api_test();
LAB_001108f4:
    pfStack_7b0 = (fdb_config *)0x1108f9;
    deleted_doc_get_api_test();
LAB_001108f9:
    pfStack_7b0 = (fdb_config *)0x1108fe;
    deleted_doc_get_api_test();
  }
  pfStack_7b0 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pcStack_b98 = (code *)0x11091c;
  pfStack_7b8 = pfVar5;
  pfStack_7b0 = unaff_R14;
  gettimeofday(&tStack_b08,(__timezone_ptr_t)0x0);
  pcStack_b98 = (code *)0x110921;
  memleak_start();
  pcStack_b98 = (code *)0x11092d;
  system("rm -rf  dummy* > errorlog.txt");
  auStack_b70._24_8_ = 0;
  pvStack_b38 = (void *)0x0;
  uStack_b40 = 0;
  auStack_b70._8_8_ = 0;
  auStack_b70._16_8_ = 0;
  uStack_b28 = 0;
  auStack_b70._32_8_ = acStack_9b0;
  pfStack_b30 = &fStack_ab0;
  fStack_b48 = 0xffffffffffffffff;
  pfVar5 = &fStack_8b0;
  pcStack_b98 = (code *)0x110980;
  fdb_get_default_config();
  fStack_8b0.purging_interval = 0;
  pcStack_b98 = (code *)0x110991;
  fdb_get_default_kvs_config();
  pcStack_b98 = (code *)0x1109a5;
  fVar1 = fdb_open(&pfStack_b88,"./dummy1",pfVar5);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_b98 = (code *)0x1109c8;
    fVar1 = fdb_kvs_open(pfStack_b88,&pfStack_b80,"main",&fStack_b20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b48;
    acStack_9b0[0] = 'K';
    acStack_9b0[1] = '\0';
    pfVar5 = &fStack_ab0;
    fStack_ab0.chunksize = 0x6f62;
    fStack_ab0._2_2_ = 0x7964;
    fStack_ab0.blocksize._0_1_ = 0;
    pcStack_b98 = (code *)0x1109f4;
    sVar4 = strlen(acStack_9b0);
    auStack_b70._0_8_ = sVar4 + 1;
    unaff_R14 = (fdb_config *)auStack_b70;
    pcStack_b98 = (code *)0x110a07;
    sVar4 = strlen((char *)pfVar5);
    auStack_b70._16_8_ = sVar4 + 1;
    pcStack_b98 = (code *)0x110a1b;
    fVar1 = fdb_set(pfStack_b80,(fdb_doc *)unaff_R14);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b4d;
    pcStack_b98 = (code *)0x110a32;
    fVar1 = fdb_del(pfStack_b80,(fdb_doc *)auStack_b70);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b52;
    pfVar5 = (fdb_config *)&pfStack_b78;
    pcStack_b98 = (code *)0x110a61;
    fdb_doc_create((fdb_doc **)pfVar5,(void *)auStack_b70._32_8_,auStack_b70._0_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pcStack_b98 = (code *)0x110a6e;
    fVar1 = fdb_get(pfStack_b80,pfStack_b78);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b57;
    pcStack_b98 = (code *)0x110a81;
    fdb_doc_free(pfStack_b78);
    pcStack_b98 = (code *)0x110a93;
    fdb_get_file_info(pfStack_b88,(fdb_file_info *)auStack_af8);
    pfVar5 = (fdb_config *)(auStack_af8 + 0x10);
    if (auStack_af8._16_8_ != 0) {
      pcStack_b98 = (code *)0x110aa9;
      deleted_doc_stat_test();
    }
    pcStack_b98 = (code *)0x110ab5;
    fVar1 = fdb_commit(pfStack_b88,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b5c;
    unaff_R14 = (fdb_config *)auStack_af8;
    pcStack_b98 = (code *)0x110ad2;
    fdb_get_file_info(pfStack_b88,(fdb_file_info *)unaff_R14);
    if (auStack_af8._16_8_ != 0) {
      pcStack_b98 = (code *)0x110ae1;
      deleted_doc_stat_test();
    }
    pcStack_b98 = (code *)0x110aeb;
    fVar1 = fdb_kvs_close(pfStack_b80);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110b61;
    pcStack_b98 = (code *)0x110af9;
    fVar1 = fdb_close(pfStack_b88);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_b98 = (code *)0x110b02;
      fdb_shutdown();
      pcStack_b98 = (code *)0x110b07;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pcStack_b98 = (code *)0x110b38;
      fprintf(_stderr,pcVar7,"deleted doc stat test");
      return;
    }
  }
  else {
    pcStack_b98 = (code *)0x110b48;
    deleted_doc_stat_test();
LAB_00110b48:
    pcStack_b98 = (code *)0x110b4d;
    deleted_doc_stat_test();
LAB_00110b4d:
    pcStack_b98 = (code *)0x110b52;
    deleted_doc_stat_test();
LAB_00110b52:
    pcStack_b98 = (code *)0x110b57;
    deleted_doc_stat_test();
LAB_00110b57:
    pcStack_b98 = (code *)0x110b5c;
    deleted_doc_stat_test();
LAB_00110b5c:
    pcStack_b98 = (code *)0x110b61;
    deleted_doc_stat_test();
LAB_00110b61:
    pcStack_b98 = (code *)0x110b66;
    deleted_doc_stat_test();
  }
  pcStack_b98 = complete_delete_test;
  deleted_doc_stat_test();
  pcStack_1020 = (code *)0x110b88;
  pfStack_bc0 = pfVar5;
  ppfStack_bb8 = unaff_R12;
  pfStack_bb0 = unaff_R13;
  pfStack_ba8 = unaff_R14;
  pcStack_ba0 = unaff_R15;
  pcStack_b98 = (code *)unaff_RBP;
  gettimeofday(&tStack_ff0,(__timezone_ptr_t)0x0);
  pcStack_1020 = (code *)0x110b8d;
  memleak_start();
  pcVar7 = acStack_cc8;
  builtin_strncpy(acStack_cc8,"./dummy1",9);
  pcStack_1020 = (code *)0x110bb2;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar5 = &fStack_dc0;
  pcStack_1020 = (code *)0x110bc2;
  fdb_get_default_config();
  fStack_dc0.buffercache_size = 0;
  kvs_config = &fStack_fe0.create_if_missing;
  pcStack_1020 = (code *)0x110bd7;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_1000;
  pcStack_1020 = (code *)0x110bea;
  fdb_open(ptr_fhandle,pcVar7,pfVar5);
  pcStack_1020 = (code *)0x110c02;
  fVar1 = fdb_kvs_open(pfStack_1000,&pfStack_1008,"db1",(fdb_kvs_config *)kvs_config);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110d9c;
  unaff_RBP = 0;
  do {
    pcStack_1020 = (code *)0x110c33;
    sprintf((char *)&fStack_ec8,"key%05d",unaff_RBP);
    pcStack_1020 = (code *)0x110c42;
    sprintf((char *)apfStack_fc8,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_1008;
    pcStack_1020 = (code *)0x110c4f;
    sVar4 = strlen((char *)&fStack_ec8);
    pcVar7 = (char *)(sVar4 + 1);
    pcStack_1020 = (code *)0x110c5b;
    sVar4 = strlen((char *)apfStack_fc8);
    pcStack_1020 = (code *)0x110c70;
    fVar1 = fdb_set_kv(unaff_R13,&fStack_ec8,(size_t)pcVar7,apfStack_fc8,sVar4 + 1);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_1020 = (code *)0x110d97;
      complete_delete_test();
      goto LAB_00110d97;
    }
    uVar6 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar6;
  } while (uVar6 != 1000);
  pcStack_1020 = (code *)0x110c91;
  fdb_commit(pfStack_1000,'\x01');
  pcVar7 = "key%05d";
  pfVar5 = &fStack_ec8;
  kvs_config = "value%05d";
  ptr_fhandle = apfStack_fc8;
  unaff_RBP = 0;
  do {
    pcStack_1020 = (code *)0x110cbd;
    sprintf((char *)pfVar5,"key%05d",unaff_RBP);
    pcStack_1020 = (code *)0x110ccc;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_1008;
    pcStack_1020 = (code *)0x110cd9;
    sVar4 = strlen((char *)pfVar5);
    pcStack_1020 = (code *)0x110ce8;
    fVar1 = fdb_del_kv(unaff_R13,pfVar5,sVar4 + 1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110d97;
    uVar6 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar6;
  } while (uVar6 != 1000);
  pcStack_1020 = (code *)0x110d09;
  fdb_commit(pfStack_1000,'\x01');
  pcStack_1020 = (code *)0x110d29;
  fVar1 = fdb_iterator_init(pfStack_1008,&pfStack_ff8,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110da1;
  pcStack_1020 = (code *)0x110d37;
  fVar1 = fdb_iterator_close(pfStack_ff8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_1020 = (code *)0x110d45;
    fdb_close(pfStack_1000);
    pcStack_1020 = (code *)0x110d4a;
    fdb_shutdown();
    pcStack_1020 = (code *)0x110d4f;
    memleak_end();
    pcVar7 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar7 = "%s FAILED\n";
    }
    pcStack_1020 = (code *)0x110d80;
    fprintf(_stderr,pcVar7,"complete delete");
    return;
  }
  goto LAB_00110da6;
LAB_00110d97:
  pfVar5 = &fStack_ec8;
  ptr_fhandle = apfStack_fc8;
  kvs_config = "value%05d";
  pcStack_1020 = (code *)0x110d9c;
  complete_delete_test();
LAB_00110d9c:
  pcStack_1020 = (code *)0x110da1;
  complete_delete_test();
LAB_00110da1:
  pcStack_1020 = (code *)0x110da6;
  complete_delete_test();
LAB_00110da6:
  pcStack_1020 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_1498 = (fdb_config *)0x110dc8;
  pcStack_1048 = pcVar7;
  ppfStack_1040 = ptr_fhandle;
  pfStack_1038 = unaff_R13;
  pfStack_1030 = pfVar5;
  pfStack_1028 = (fdb_kvs_config *)kvs_config;
  pcStack_1020 = (code *)unaff_RBP;
  gettimeofday(&tStack_1460,(__timezone_ptr_t)0x0);
  pfStack_1498 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_1498 = (fdb_config *)0x110dd7;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_1498 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar5 = &fStack_1348;
  pfStack_1498 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_1498 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_1498 = (fdb_config *)0x110e14;
  fVar1 = fdb_open(&pfStack_1488,"./dummy1",pfVar5);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_1498 = (fdb_config *)0x110e32;
    fVar1 = fdb_kvs_open(pfStack_1488,&pfStack_1480,(char *)0x0,&fStack_1478);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    pcVar7 = (char *)0x0;
    uVar9 = 0;
    do {
      pfStack_1498 = (fdb_config *)0x110e5b;
      sprintf(acStack_1150,"key%128d",uVar9 & 0xffffffff);
      pfStack_1498 = (fdb_config *)0x110e77;
      sprintf(acStack_1250,"meta%128d",uVar9 & 0xffffffff);
      pfStack_1498 = (fdb_config *)0x110e8d;
      sprintf(acStack_1450,"body%128d",uVar9 & 0xffffffff);
      pfStack_1498 = (fdb_config *)0x110e99;
      sVar4 = strlen(acStack_1150);
      pfStack_1498 = (fdb_config *)0x110ea7;
      metalen = strlen(acStack_1250);
      pfStack_1498 = (fdb_config *)0x110eb4;
      bodylen = strlen(acStack_1450);
      pfStack_1498 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)(pcVar7 + (long)&__ptr->chunksize),acStack_1150,sVar4,acStack_1250,
                     metalen,acStack_1450,bodylen);
      pfStack_1498 = (fdb_config *)0x110eec;
      fdb_set(pfStack_1480,*(fdb_doc **)(&__ptr->chunksize + uVar9 * 4));
      pfStack_1498 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar9 * 4));
      uVar9 = uVar9 + 1;
      pcVar7 = pcVar7 + 8;
    } while (uVar9 != 500000);
    pfStack_1498 = (fdb_config *)0x110f13;
    fVar1 = fdb_kvs_close(pfStack_1480);
    pfVar5 = __ptr;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_1498 = (fdb_config *)0x110f25;
    fVar1 = fdb_close(pfStack_1488);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_1498 = (fdb_config *)0x110f46;
    fVar1 = fdb_open(&pfStack_1488,"./dummy1",&fStack_1348);
    if (fVar1 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_1498 = (fdb_config *)0x110f65;
      free(__ptr);
      pfStack_1498 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_1498 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_1498 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar7,"large batch write test with no commits");
      return;
    }
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_1498 = (fdb_config *)0x110f59;
      fVar1 = fdb_close(pfStack_1488);
      if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_1498 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_1498 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_1498 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_1498 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_1498 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_1498 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_14a8 = pcVar7;
  pfStack_14a0 = pfVar5;
  pfStack_1498 = __ptr;
  gettimeofday(&tStack_16c8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_16a0.wal_threshold = 0x400;
  fStack_16a0.seqtree_opt = '\x01';
  fStack_16a0.purging_interval = 1;
  fStack_16a0.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_16d0,"./dummy1",&fStack_16a0);
  fdb_kvs_open(pfStack_16d0,&pfStack_16d8,"db1",&fStack_16b8);
  sprintf(acStack_15a8,"key%d",0);
  sVar4 = strlen(acStack_15a8);
  fdb_doc_create(&pfStack_16e0,acStack_15a8,sVar4,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_16d8,pfStack_16e0);
  fVar1 = fdb_get(pfStack_16d8,pfStack_16e0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_byoffset(pfStack_16d8,pfStack_16e0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_get_metaonly(pfStack_16d8,pfStack_16e0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_get_metaonly_byseq(pfStack_16d8,pfStack_16e0);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_16d8,pfStack_16e0);
        fVar1 = fdb_get(pfStack_16d8,pfStack_16e0);
        if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_16e0->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar1 = fdb_get_metaonly(pfStack_16d8,pfStack_16e0);
          if (fVar1 == FDB_RESULT_SUCCESS) {
            if (pfStack_16e0->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar1 = fdb_get_metaonly_byseq(pfStack_16d8,pfStack_16e0);
            if (fVar1 == FDB_RESULT_SUCCESS) {
              if (pfStack_16e0->deleted != false) {
                fVar1 = fdb_get_byoffset(pfStack_16d8,pfStack_16e0);
                if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_16e0->deleted != false) {
                    fdb_doc_free(pfStack_16e0);
                    fdb_kvs_close(pfStack_16d8);
                    fdb_close(pfStack_16d0);
                    fdb_shutdown();
                    memleak_end();
                    pcVar7 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar7 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar7,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void config_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int nfiles = 4;
    int i;
    size_t bcache_space_used;
    char fname[256];

    // remove previous dummy test files
    int r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    bcache_space_used = fdb_get_buffer_cache_used();
    TEST_CHK(bcache_space_used == 0);

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= (uint64_t) -1;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_TOO_BIG_BUFFER_CACHE);

    fconfig = fdb_get_default_config();
    fconfig.max_writer_lock_prob = 120;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    for (i = nfiles; i; --i) {
        sprintf(fname, "dummy%d", i);
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        bcache_space_used = fdb_get_buffer_cache_used();

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);
        // Buffercache must only have KV name header + stale-tree root
        TEST_CHK(bcache_space_used == fconfig.blocksize * 2);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_open(&dbfile, fname, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(db, (void*)"key", 3, (void*)"body", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    bcache_space_used = fdb_get_buffer_cache_used();

    // Since V3 magic number, 8 blocks are used:
    // 7 blocks created eariler + document block for KV pair
    TEST_CHK(bcache_space_used == fconfig.blocksize * 8);

    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("forestdb config test");
}